

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall LFPConsumer::~LFPConsumer(LFPConsumer *this)

{
  LFPConsumer *in_RDI;
  
  ~LFPConsumer(in_RDI);
  operator_delete(in_RDI,0x420);
  return;
}

Assistant:

LFPConsumer::~LFPConsumer(){

}